

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,REF_DBL *xyz,REF_INT *tet,REF_DBL *bary)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  int iVar1;
  uint uVar2;
  int cell;
  uint unaff_R14D;
  int cell_00;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  if (ref_cell->max < 1) {
    cell_00 = -1;
  }
  else {
    cell_00 = -1;
    cell = 0;
    dVar3 = -999.0;
    do {
      dVar4 = dVar3;
      iVar1 = cell_00;
      if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
        uVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x378,"ref_grid_exhaustive_enclosing_tet",(ulong)uVar2,"cell");
          return uVar2;
        }
        uVar2 = ref_node_bary4(ref_node,local_a8,xyz,bary);
        if ((uVar2 & 0xfffffffb) != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x379,"ref_grid_exhaustive_enclosing_tet",(ulong)uVar2,"bary");
          unaff_R14D = uVar2;
        }
        if ((uVar2 & 0xfffffffb) != 0) {
          return unaff_R14D;
        }
        dVar4 = *bary;
        if (bary[1] <= *bary) {
          dVar4 = bary[1];
        }
        dVar5 = bary[2];
        if (bary[3] <= bary[2]) {
          dVar5 = bary[3];
        }
        if (dVar5 <= dVar4) {
          dVar4 = dVar5;
        }
        iVar1 = cell;
        if ((cell_00 != -1) && (dVar4 <= dVar3)) {
          dVar4 = dVar3;
          iVar1 = cell_00;
        }
      }
      cell_00 = iVar1;
      cell = cell + 1;
      dVar3 = dVar4;
    } while (cell < ref_cell->max);
  }
  if (cell_00 == -1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x381,
           "ref_grid_exhaustive_enclosing_tet","failed to find cell");
    uVar2 = 1;
  }
  else {
    *tet = cell_00;
    uVar2 = ref_cell_nodes(ref_cell,cell_00,local_a8);
    if (uVar2 == 0) {
      uVar2 = ref_node_bary4(ref_node,local_a8,xyz,bary);
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x385,"ref_grid_exhaustive_enclosing_tet",(ulong)uVar2,"bary");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",900,
             "ref_grid_exhaustive_enclosing_tet",(ulong)uVar2,"cell");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,
                                                            REF_DBL *xyz,
                                                            REF_INT *tet,
                                                            REF_DBL *bary) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT guess, best_guess;
  REF_DBL best_bary, min_bary;

  best_guess = REF_EMPTY;
  best_bary = -999.0;
  each_ref_cell_valid_cell(ref_cell, guess) {
    RSS(ref_cell_nodes(ref_cell, guess, nodes), "cell");
    RXS(ref_node_bary4(ref_node, nodes, xyz, bary), REF_DIV_ZERO, "bary");
    min_bary = MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
    if (REF_EMPTY == best_guess || min_bary > best_bary) {
      best_guess = guess;
      best_bary = min_bary;
    }
  }

  RUS(REF_EMPTY, best_guess, "failed to find cell");

  *tet = best_guess;
  RSS(ref_cell_nodes(ref_cell, best_guess, nodes), "cell");
  RSS(ref_node_bary4(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}